

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# folding_rules.cpp
# Opt level: O3

bool spvtools::opt::anon_unknown_0::HasZero(Constant *c)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  bool bVar3;
  undefined1 uVar4;
  int iVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long *plVar6;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined8 *puVar7;
  
  iVar5 = (*c->_vptr_Constant[0x16])();
  bVar3 = true;
  if (CONCAT44(extraout_var,iVar5) == 0) {
    iVar5 = (*c->_vptr_Constant[0x13])(c);
    plVar6 = (long *)CONCAT44(extraout_var_00,iVar5);
    if (plVar6 == (long *)0x0) {
      iVar5 = (*c->_vptr_Constant[0xd])(c);
      if (CONCAT44(extraout_var_01,iVar5) != 0) {
        iVar5 = (*c->_vptr_Constant[0xd])(c);
        uVar4 = (**(code **)(*(long *)CONCAT44(extraout_var_02,iVar5) + 0xb8))
                          ((long *)CONCAT44(extraout_var_02,iVar5));
        return (bool)uVar4;
      }
      __assert_fail("c->AsScalarConstant()",
                    "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/folding_rules.cpp"
                    ,0x21a,
                    "bool spvtools::opt::(anonymous namespace)::HasZero(const analysis::Constant *)"
                   );
    }
    plVar6 = (long *)(**(code **)(*plVar6 + 0xc0))(plVar6);
    puVar1 = (undefined8 *)*plVar6;
    puVar2 = (undefined8 *)plVar6[1];
    if (puVar1 == puVar2) {
      bVar3 = false;
    }
    else {
      do {
        puVar7 = puVar1 + 1;
        bVar3 = HasZero((Constant *)*puVar1);
        if (bVar3) {
          return bVar3;
        }
        puVar1 = puVar7;
      } while (puVar7 != puVar2);
    }
  }
  return bVar3;
}

Assistant:

bool HasZero(const analysis::Constant* c) {
  if (c->AsNullConstant()) {
    return true;
  }
  if (const analysis::VectorConstant* vec_const = c->AsVectorConstant()) {
    for (auto& comp : vec_const->GetComponents())
      if (HasZero(comp)) return true;
  } else {
    assert(c->AsScalarConstant());
    return c->AsScalarConstant()->IsZero();
  }

  return false;
}